

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp:494:58)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_date_object_cpp:494:58)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  long *plVar1;
  undefined8 *puVar2;
  object_ptr o;
  value to_iso;
  value tv;
  gc_heap_ptr_untyped local_b8;
  undefined1 local_a8 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_a0;
  undefined1 local_80 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_78;
  vector<mjs::value,_std::allocator<mjs::value>_> local_58;
  value local_40;
  
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  (**(code **)(*plVar1 + 0x88))(&local_b8,plVar1,this_);
  local_a8._0_4_ = object;
  local_a0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_b8.heap_;
  local_a0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_b8.pos_;
  if (local_b8.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_b8.heap_,(gc_heap_ptr_untyped *)(local_a8 + 8));
  }
  to_primitive(&local_40,(value *)local_a8,number);
  value::destroy((value *)local_a8);
  if ((local_40.type_ == number) &&
     (0x7fefffffffffffff <
      ((ulong)local_40.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_
      & 0x7fffffffffffffff))) {
    value::value(__return_storage_ptr__,(value *)value::null);
  }
  else {
    puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&local_b8);
    local_80 = (undefined1  [8])0xb;
    local_78.n_ = 8.45441180638374e-318;
    (**(code **)*puVar2)(local_a8,puVar2);
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_b8.heap_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_b8.pos_;
    if (local_b8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_b8.heap_,(gc_heap_ptr_untyped *)&local_78.s_);
    }
    local_58.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    call_function(__return_storage_ptr__,(value *)local_a8,(value *)local_80,&local_58);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_58);
    value::destroy((value *)local_80);
    value::destroy((value *)local_a8);
  }
  value::destroy(&local_40);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }